

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_flac_ogg__read_page_header_after_capture_pattern
                    (ma_dr_flac_read_proc onRead,void *pUserData,ma_dr_flac_ogg_page_header *pHeader
                    ,ma_uint32 *pBytesRead,ma_uint32 *pCRC32)

{
  long lVar1;
  ulong uVar2;
  int *in_RCX;
  undefined1 *in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  uint *in_R8;
  ma_uint32 i;
  ma_uint8 data [23];
  uint local_5c;
  byte local_58 [2];
  undefined8 local_56;
  undefined4 local_4e;
  undefined4 local_4a;
  undefined4 local_46;
  undefined1 local_42;
  uint *local_40;
  int *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  code *local_20;
  ma_result local_14;
  byte local_5;
  uint local_4;
  
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  lVar1 = (*in_RDI)(in_RSI,local_58,0x17);
  if (lVar1 == 0x17) {
    *local_38 = *local_38 + 0x17;
    *local_30 = 0x4f;
    local_30[1] = 0x67;
    local_30[2] = 0x67;
    local_30[3] = 0x53;
    local_30[4] = local_58[0];
    local_30[5] = local_58[1];
    *(undefined8 *)(local_30 + 8) = local_56;
    *(undefined4 *)(local_30 + 0x10) = local_4e;
    *(undefined4 *)(local_30 + 0x14) = local_4a;
    *(undefined4 *)(local_30 + 0x18) = local_46;
    local_30[0x1c] = local_42;
    local_46 = 0;
    for (local_5c = 0; local_5c < 0x17; local_5c = local_5c + 1) {
      local_4 = *local_40;
      local_5 = local_58[local_5c];
      *local_40 = local_4 << 8 ^ ma_dr_flac__crc32_table[(int)(local_4 >> 0x18 ^ (uint)local_5)];
    }
    uVar2 = (*local_20)(local_28,local_30 + 0x1d,local_30[0x1c]);
    if (uVar2 == (byte)local_30[0x1c]) {
      *local_38 = (uint)(byte)local_30[0x1c] + *local_38;
      for (local_5c = 0; local_5c < (byte)local_30[0x1c]; local_5c = local_5c + 1) {
        *local_40 = *local_40 << 8 ^
                    ma_dr_flac__crc32_table
                    [(int)(*local_40 >> 0x18 ^ (uint)(byte)local_30[(ulong)local_5c + 0x1d])];
      }
      local_14 = MA_SUCCESS;
    }
    else {
      local_14 = MA_AT_END;
    }
  }
  else {
    local_14 = MA_AT_END;
  }
  return local_14;
}

Assistant:

static ma_result ma_dr_flac_ogg__read_page_header_after_capture_pattern(ma_dr_flac_read_proc onRead, void* pUserData, ma_dr_flac_ogg_page_header* pHeader, ma_uint32* pBytesRead, ma_uint32* pCRC32)
{
    ma_uint8 data[23];
    ma_uint32 i;
    MA_DR_FLAC_ASSERT(*pCRC32 == MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32);
    if (onRead(pUserData, data, 23) != 23) {
        return MA_AT_END;
    }
    *pBytesRead += 23;
    pHeader->capturePattern[0] = 'O';
    pHeader->capturePattern[1] = 'g';
    pHeader->capturePattern[2] = 'g';
    pHeader->capturePattern[3] = 'S';
    pHeader->structureVersion = data[0];
    pHeader->headerType       = data[1];
    MA_DR_FLAC_COPY_MEMORY(&pHeader->granulePosition, &data[ 2], 8);
    MA_DR_FLAC_COPY_MEMORY(&pHeader->serialNumber,    &data[10], 4);
    MA_DR_FLAC_COPY_MEMORY(&pHeader->sequenceNumber,  &data[14], 4);
    MA_DR_FLAC_COPY_MEMORY(&pHeader->checksum,        &data[18], 4);
    pHeader->segmentCount     = data[22];
    data[18] = 0;
    data[19] = 0;
    data[20] = 0;
    data[21] = 0;
    for (i = 0; i < 23; ++i) {
        *pCRC32 = ma_dr_flac_crc32_byte(*pCRC32, data[i]);
    }
    if (onRead(pUserData, pHeader->segmentTable, pHeader->segmentCount) != pHeader->segmentCount) {
        return MA_AT_END;
    }
    *pBytesRead += pHeader->segmentCount;
    for (i = 0; i < pHeader->segmentCount; ++i) {
        *pCRC32 = ma_dr_flac_crc32_byte(*pCRC32, pHeader->segmentTable[i]);
    }
    return MA_SUCCESS;
}